

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

object __thiscall pybind11::getattr(pybind11 *this,handle obj,char *name)

{
  PyObject **ppPVar1;
  error_already_set *this_00;
  handle local_40 [3];
  _object *local_28;
  PyObject *result;
  char *name_local;
  handle obj_local;
  
  result = (PyObject *)name;
  name_local = (char *)obj.m_ptr;
  obj_local.m_ptr = (PyObject *)this;
  ppPVar1 = handle::ptr((handle *)&name_local);
  local_28 = (_object *)PyObject_GetAttrString(*ppPVar1,result);
  if (local_28 == (_object *)0x0) {
    this_00 = (error_already_set *)__cxa_allocate_exception(0x18);
    error_already_set::error_already_set(this_00);
    __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  handle::handle<_object_*,_0>(local_40,local_28);
  reinterpret_steal<pybind11::object>(this,local_40[0]);
  return (object)(handle)this;
}

Assistant:

inline object getattr(handle obj, const char *name) {
    PyObject *result = PyObject_GetAttrString(obj.ptr(), name);
    if (!result) {
        throw error_already_set();
    }
    return reinterpret_steal<object>(result);
}